

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-syntax.cc
# Opt level: O2

int parse_command_line(int argc,char **argv)

{
  int iVar1;
  undefined8 in_RAX;
  runtime_error *this;
  code *pcVar2;
  undefined *puVar3;
  undefined4 uStack_38;
  int long_option_index;
  
  _uStack_38 = in_RAX;
  do {
    _uStack_38 = CONCAT44(0xffffffff,uStack_38);
    iVar1 = getopt_long(argc,argv,"cd:hn:o:ptj",long_options,&long_option_index);
    switch(iVar1) {
    case 99:
      check_syntax = 1;
      break;
    case 100:
      std::__cxx11::string::assign((char *)&delimiter_abi_cxx11_);
      break;
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x71:
    case 0x72:
    case 0x73:
switchD_00119336_caseD_65:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"This should never be executed");
LAB_001194b3:
      puVar3 = &std::runtime_error::typeinfo;
      pcVar2 = std::runtime_error::~runtime_error;
LAB_001194c1:
      __cxa_throw(this,puVar3,pcVar2);
    case 0x68:
      help = 1;
      break;
    case 0x6a:
      json = 1;
      break;
    case 0x6e:
      std::__cxx11::string::assign((char *)&process_name_abi_cxx11_);
      break;
    case 0x6f:
      if (*_optarg == '\0') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  ((invalid_argument *)this,"Invalid empty output file name");
        puVar3 = &std::invalid_argument::typeinfo;
        pcVar2 = std::invalid_argument::~invalid_argument;
        goto LAB_001194c1;
      }
      std::__cxx11::string::assign((char *)&output_file_abi_cxx11_);
      break;
    case 0x70:
      synchronized_product = 1;
      break;
    case 0x74:
      transform = 1;
      break;
    default:
      if (iVar1 != 0) {
        if (iVar1 == -1) {
          return _optind;
        }
        if (iVar1 == 0x3f) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Unknown command-line option");
          goto LAB_001194b3;
        }
        if (iVar1 == 0x3a) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Missing option parameter");
          goto LAB_001194b3;
        }
        goto switchD_00119336_caseD_65;
      }
      iVar1 = strcmp(long_options[long_option_index].name,"asynchronous-events");
      if (iVar1 != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"This also should never be executed");
        goto LAB_001194b3;
      }
      report_asynchronous_events = 1;
    }
  } while( true );
}

Assistant:

int parse_command_line(int argc, char * argv[])
{
  while (true) {
    int long_option_index = -1;
    int c = getopt_long(argc, argv, options, long_options, &long_option_index);

    if (c == -1)
      break;

    if (c == ':')
      throw std::runtime_error("Missing option parameter");
    else if (c == '?')
      throw std::runtime_error("Unknown command-line option");
    else if (c != 0) {
      switch (c) {
      case 'c':
        check_syntax = true;
        break;
      case 'd':
        delimiter = optarg;
        break;
      case 'h':
        help = true;
        break;
      case 'n':
        process_name = optarg;
        break;
      case 'o':
        if (strcmp(optarg, "") == 0)
          throw std::invalid_argument("Invalid empty output file name");
        output_file = optarg;
        break;
      case 'p':
        synchronized_product = true;
        break;
      case 't':
        transform = true;
        break;
      case 'j':
        json = true;
        break;
      default:
        throw std::runtime_error("This should never be executed");
        break;
      }
    }
    else {
      if (strcmp(long_options[long_option_index].name, "asynchronous-events") == 0)
        report_asynchronous_events = true;
      else
        throw std::runtime_error("This also should never be executed");
    }
  }

  return optind;
}